

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_commandline.hpp
# Opt level: O2

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  domain_error *this;
  string line;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream f;
  
  std::ifstream::ifstream(&f,(_filename->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&f,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      trim(&local_278,&line);
      std::__cxx11::string::operator=((string *)&line,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      if (line._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_278,"#",(allocator *)&local_258);
        bVar2 = startsWith(&line,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        if (!bVar2) {
          std::operator+(&local_258,"\"",&line);
          std::operator+(&local_278,&local_258,"\",");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&config->testsOrTags,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_258);
        }
      }
    }
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&f);
    return;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&line,"Unable to load input file: ",_filename);
  std::domain_error::domain_error(this,(string *)&line);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, "#" ) )
                addTestOrTags( config, "\"" + line + "\"," );
        }
    }